

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

uint prvTidyReadChar(StreamIn *in)

{
  undefined4 uVar1;
  undefined4 uVar2;
  short sVar3;
  undefined2 uVar4;
  TidyDocImpl *doc;
  Lexer *pLVar5;
  unsigned_short uVar6;
  uint uVar7;
  uint uVar8;
  Bool BVar9;
  uint ch;
  uint *puVar10;
  uint uVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  
  if (in->pushed == no) {
    iVar13 = *(int *)&in->curlastpos;
    uVar7 = iVar13 + 1U & 0x3f;
    uVar6 = (unsigned_short)uVar7;
    in->curlastpos = uVar6;
    if (uVar6 == in->firstlastpos) {
      in->firstlastpos = (short)iVar13 + 2U & 0x3f;
    }
    iVar13 = in->curcol;
    in->lastcols[uVar7] = iVar13;
    if (in->tabs < 1) {
LAB_00131faa:
      do {
        do {
          uVar8 = ReadCharFromStream(in);
          if ((int)uVar8 < 10) {
            if (uVar8 == 0xffffffff) {
              return 0xffffffff;
            }
            if (uVar8 == 9) {
              uVar8 = 9;
              if (*(int *)((in->doc->config).value + 0x2b) == 0) {
                uVar7 = *(uint *)((in->doc->config).value + 0x53);
                if (uVar7 == 0) {
                  iVar13 = 0;
                }
                else {
                  iVar13 = ~((in->curcol - 1U) % uVar7) + uVar7;
                }
                in->tabs = iVar13;
                uVar8 = 0x20;
              }
              goto LAB_00132246;
            }
          }
          else {
            if (uVar8 == 0x1b) {
              return 0x1b;
            }
            if (uVar8 == 0xd) {
              uVar8 = ReadCharFromStream(in);
              if (uVar8 != 10) {
                prvTidyUngetChar(uVar8,in);
              }
LAB_00132220:
              in->curcol = 1;
              in->curline = in->curline + 1;
              return 10;
            }
            if (uVar8 == 10) goto LAB_00132220;
          }
        } while (uVar8 < 0x20);
        uVar7 = in->encoding;
        if (uVar7 - 9 < 3) {
          BVar9 = prvTidyIsValidUTF16FromUCS4(uVar8);
          uVar14 = uVar8;
          if (BVar9 == no) {
LAB_0013209c:
            prvTidyReportEncodingError(in->doc,0x24c,uVar14,yes);
            uVar8 = 0;
          }
          else {
            BVar9 = prvTidyIsLowSurrogate(uVar8);
            if (BVar9 != no) {
              ch = ReadCharFromStream(in);
              if (ch == 0xffffffff) {
                return 0xffffffff;
              }
              BVar9 = prvTidyIsHighSurrogate(ch);
              uVar14 = 0;
              if (BVar9 != no) {
                uVar8 = prvTidyCombineSurrogatePair(ch,uVar8);
                BVar9 = prvTidyIsValidCombinedChar(uVar8);
                if (uVar8 == 0) {
                  uVar14 = 0;
                }
                else {
                  uVar14 = 0;
                  if (BVar9 != no) goto LAB_001320b5;
                }
              }
              goto LAB_0013209c;
            }
          }
LAB_001320b5:
          uVar7 = in->encoding;
        }
        else if ((uVar7 < 0xe) && ((0x3031U >> (uVar7 & 0x1f) & 1) != 0)) {
LAB_00132246:
          in->curcol = in->curcol + 1;
          return uVar8;
        }
        if (uVar7 == 2) {
          if (uVar8 - 0xa4 < 0x1b) {
            uVar11 = uVar8 & 0xff;
            if (uVar11 < 0xb4) {
              if (uVar11 == 0xa4) {
                uVar14 = 0x20ac;
                break;
              }
              if (uVar11 == 0xa6) {
                uVar14 = 0x160;
                break;
              }
              if (uVar11 == 0xa8) {
                uVar14 = 0x161;
                break;
              }
            }
            else {
              switch(uVar11) {
              case 0xb4:
                uVar14 = 0x17d;
                goto LAB_00132292;
              case 0xb8:
                uVar14 = 0x17e;
                goto LAB_00132292;
              case 0xbc:
                uVar14 = 0x152;
                goto LAB_00132292;
              case 0xbd:
                uVar14 = 0x153;
                goto LAB_00132292;
              case 0xbe:
                uVar14 = 0x178;
                goto LAB_00132292;
              }
            }
          }
        }
        else {
          puVar10 = IBM2Unicode;
          if (((uVar7 == 8) || (puVar10 = Mac2Unicode, uVar7 == 6)) &&
             ((uVar8 & 0xffffff80) == 0x80)) {
            uVar8 = puVar10[uVar8 - 0x80];
          }
        }
        uVar14 = uVar8;
        if ((uVar8 & 0xffffffe0) == 0x80) {
          doc = in->doc;
          pLVar5 = doc->lexer;
          if (pLVar5 != (Lexer *)0x0) {
            uVar1 = in->curcol;
            uVar2 = in->curline;
            pLVar5->lines = uVar2;
            pLVar5->columns = uVar1;
          }
          puVar10 = Win2Unicode;
          if (uVar7 == 6) {
            puVar10 = Mac2Unicode;
          }
          uVar14 = puVar10[uVar8 - 0x80];
          if (((uVar7 & 0xfffffffe) == 6) && (uVar14 == 0)) {
            prvTidyReportEncodingError(doc,0x28f,uVar8,yes);
            goto LAB_00131faa;
          }
          if ((uVar7 & 0xfffffffe) != 6) {
            prvTidyReportEncodingError(doc,0x24a,uVar8,(uint)(uVar14 == 0));
          }
        }
      } while (uVar14 == 0);
LAB_00132292:
      in->curcol = in->curcol + 1;
    }
    else {
      in->curcol = iVar13 + 1;
      in->tabs = in->tabs + -1;
      uVar14 = 0x20;
    }
  }
  else {
    if (in->bufpos == 0) {
      __assert_fail("in->bufpos > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/streamio.c"
                    ,0x1a5,"uint PopChar(StreamIn *)");
    }
    uVar7 = in->bufpos - 1;
    in->bufpos = uVar7;
    uVar14 = in->charbuf[uVar7];
    if (uVar7 == 0) {
      in->pushed = no;
    }
    if (uVar14 == 10) {
      in->curcol = 1;
      in->curline = in->curline + 1;
      sVar3 = in->curlastpos;
      uVar12 = sVar3 + 1U & 0x3f;
      in->curlastpos = uVar12;
      if (uVar12 != in->firstlastpos) {
        return 10;
      }
    }
    else {
      in->curcol = in->curcol + 1;
      uVar4 = in->curlastpos;
      uVar12 = uVar4 + 1 & 0x3f;
      in->curlastpos = uVar12;
      sVar3 = uVar4;
      if (uVar12 != in->firstlastpos) {
        return uVar14;
      }
    }
    in->firstlastpos = sVar3 + 2U & 0x3f;
  }
  return uVar14;
}

Assistant:

uint TY_(ReadChar)( StreamIn *in )
{
    uint c = EndOfStream;

    if ( in->pushed )
        return PopChar( in );

    SaveLastPos( in );

    if ( in->tabs > 0 )
    {
        in->curcol++;
        in->tabs--;
        return ' ';
    }
    
    for (;;)
    {
        c = ReadCharFromStream(in);

        if ( EndOfStream == c )
            return EndOfStream;

        if (c == '\n')
        {
            in->curcol = 1;
            in->curline++;
            break;
        }

        if (c == '\t')
        {
            Bool keeptabs = cfg( in->doc, TidyKeepTabs );
            if (!keeptabs) {
                uint tabsize = cfg(in->doc, TidyTabSize);
                in->tabs = tabsize > 0 ?
                    tabsize - ((in->curcol - 1) % tabsize) - 1
                    : 0;
                c = ' ';
            }
            in->curcol++;
            break;
        }

        /* #427663 - map '\r' to '\n' - Andy Quick 11 Aug 00 */
        if (c == '\r')
        {
            c = ReadCharFromStream(in);
            if (c != '\n')
            {
                TY_(UngetChar)( c, in );
                c = '\n';
            }
            else
            {
            }
            in->curcol = 1;
            in->curline++;
            break;
        }

#ifndef NO_NATIVE_ISO2022_SUPPORT
        /* strip control characters, except for Esc */
        if (c == '\033')
            break;
#endif

        /* Form Feed is allowed in HTML */
        if ( c == '\015' && !cfgBool(in->doc, TidyXmlTags) )
            break;
            
        if ( c < 32 )
            continue; /* discard control char */

        /* watch out for chars that have already been decoded such as */
        /* IS02022, UTF-8 etc, that don't require further decoding */

        if (
            in->encoding == RAW
#ifndef NO_NATIVE_ISO2022_SUPPORT
         || in->encoding == ISO2022
#endif
         || in->encoding == UTF8
         || in->encoding == SHIFTJIS /* #431953 - RJ */
         || in->encoding == BIG5     /* #431953 - RJ */
           )
        {
            in->curcol++;
            break;
        }

        /* handle surrogate pairs */
        if ( in->encoding == UTF16LE ||
             in->encoding == UTF16   ||
             in->encoding == UTF16BE )
        {
            if ( !TY_(IsValidUTF16FromUCS4)(c) )
            {
                /* invalid UTF-16 value */
                TY_(ReportEncodingError)(in->doc, INVALID_UTF16, c, yes);
                c = 0;
            }
            else if ( TY_(IsLowSurrogate)(c) )
            {
                uint n = c;
                uint m = ReadCharFromStream( in );
                if ( m == EndOfStream )
                   return EndOfStream;

                c = 0;
                if ( TY_(IsHighSurrogate)(m) )
                {
                    n = TY_(CombineSurrogatePair)( m, n );
                    if ( TY_(IsValidCombinedChar)(n) )
                        c = n;
                }
                /* not a valid pair */
                if ( 0 == c )
                    TY_(ReportEncodingError)( in->doc, INVALID_UTF16, c, yes );
            }
        }

        /* Do first: acts on range 128 - 255 */
        switch ( in->encoding )
        {
        case MACROMAN:
            c = TY_(DecodeMacRoman)( c );
            break;
        case IBM858:
            c = DecodeIbm850( c );
            break;
        case LATIN0:
            c = DecodeLatin0( c );
            break;
        }

        /* produced e.g. as a side-effect of smart quotes in Word */
        /* but can't happen if using MACROMAN encoding */
        if ( 127 < c && c < 160 )
        {
            uint c1 = 0, replMode = DISCARDED_CHAR;
            Bool isVendorChar = ( in->encoding == WIN1252 ||
                                  in->encoding == MACROMAN );
            Bool isMacChar    = ( in->encoding == MACROMAN );
            
            /* set error position just before offending character */
            if (in->doc->lexer)
            {
                in->doc->lexer->lines = in->curline;
                in->doc->lexer->columns = in->curcol;
            }
                
            if ( isMacChar )
                c1 = TY_(DecodeMacRoman)( c );
            else
                c1 = TY_(DecodeWin1252)( c );
            if ( c1 )
                replMode = REPLACED_CHAR;
                
            if ( c1 == 0 && isVendorChar )
                TY_(ReportEncodingError)(in->doc, VENDOR_SPECIFIC_CHARS, c, replMode == DISCARDED_CHAR);
            else if ( ! isVendorChar )
                TY_(ReportEncodingError)(in->doc, INVALID_SGML_CHARS, c, replMode == DISCARDED_CHAR);
                
            c = c1;
        }

        if ( c == 0 )
            continue; /* illegal char is discarded */
        
        in->curcol++;
        break;
    }

    return c;
}